

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusplatforminputcontext.cpp
# Opt level: O3

QString * QIBusPlatformInputContextPrivate::getSocketPath(void)

{
  Data *pDVar1;
  int iVar2;
  char *pcVar3;
  storage_type *psVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  QArrayData *pQVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Data *pDVar10;
  QArrayData *pQVar11;
  void *pvVar12;
  char *pcVar13;
  QString *in_RDI;
  ulong uVar14;
  longlong __old_val_1;
  uint uVar15;
  char *b;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  longlong __old_val;
  QArrayData *local_238;
  char16_t *pcStack_230;
  qsizetype local_228;
  QArrayData *local_218;
  char16_t *pcStack_210;
  qsizetype local_208;
  QArrayData *local_200;
  char *local_1f8;
  qsizetype local_1f0;
  QArrayData *local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  QByteArray local_1c8;
  QByteArray local_1a8;
  QByteArray local_188;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
  local_170;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
  local_118;
  undefined2 local_c0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
  local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_188.d.d = (Data *)0x0;
  local_188.d.ptr = (char *)0x0;
  local_188.d.size = 0;
  local_1a8.d.size = -0x5555555555555556;
  local_1a8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_1a8.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_1a8,"0",-1);
  (in_RDI->d).size = -0x5555555555555556;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  qEnvironmentVariable((char *)in_RDI);
  if ((in_RDI->d).ptr != (char16_t *)0x0) goto LAB_00111c77;
  qgetenv((char *)&local_b8);
  pQVar11 = (QArrayData *)CONCAT44(local_b8.a.a.a.a.a.a.d.d._4_4_,local_b8.a.a.a.a.a.a.d.d._0_4_);
  pcVar13 = (char *)CONCAT44(local_b8.a.a.a.a.a.a.d.ptr._4_4_,(int)local_b8.a.a.a.a.a.a.d.ptr);
  local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(local_188.d.d,0);
  local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_188.d.d >> 0x20);
  uVar14 = CONCAT44(local_b8.a.a.a.a.a.a.d.size._4_4_,(undefined4)local_b8.a.a.a.a.a.a.d.size);
  local_b8.a.a.a.a.a.a.d.ptr._0_4_ = (int)local_188.d.ptr;
  local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)local_188.d.ptr >> 0x20);
  local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)local_188.d.size;
  local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)local_188.d.size >> 0x20);
  local_188.d.ptr = pcVar13;
  local_188.d.size = uVar14;
  if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,1,0x10);
      local_188.d.d = (Data *)pQVar11;
      pQVar11 = &(local_188.d.d)->super_QArrayData;
    }
  }
  local_188.d.d = (Data *)pQVar11;
  qVar6 = local_188.d.size;
  pQVar11 = &(local_188.d.d)->super_QArrayData;
  if (local_188.d.size == 0) {
    qgetenv((char *)&local_b8);
    pDVar10 = local_188.d.d;
    pQVar11 = (QArrayData *)CONCAT44(local_b8.a.a.a.a.a.a.d.d._4_4_,local_b8.a.a.a.a.a.a.d.d._0_4_);
    pcVar13 = (char *)CONCAT44(local_b8.a.a.a.a.a.a.d.ptr._4_4_,(int)local_b8.a.a.a.a.a.a.d.ptr);
    local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(local_188.d.d,0);
    local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_188.d.d >> 0x20);
    uVar14 = CONCAT44(local_b8.a.a.a.a.a.a.d.size._4_4_,(undefined4)local_b8.a.a.a.a.a.a.d.size);
    local_b8.a.a.a.a.a.a.d.ptr._0_4_ = (int)local_188.d.ptr;
    local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)local_188.d.ptr >> 0x20);
    local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)local_188.d.size;
    local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)local_188.d.size >> 0x20);
    local_188.d.ptr = pcVar13;
    local_188.d.size = uVar14;
    if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        local_188.d.d = (Data *)pQVar11;
        QArrayData::deallocate(&pDVar10->super_QArrayData,1,0x10);
        pQVar11 = &(local_188.d.d)->super_QArrayData;
      }
    }
  }
  local_188.d.d = (Data *)pQVar11;
  pDVar1 = (in_RDI->d).d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((in_RDI->d).d)->super_QArrayData,2,0x10);
    }
  }
  local_1c8.d.size = -0x5555555555555556;
  local_1c8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_1c8.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_1c8,"unix",-1);
  uVar14 = local_188.d.size;
  pcVar13 = local_188.d.ptr;
  if (qVar6 == 0) {
    if (local_188.d.size == 0) {
      uVar14 = 0;
LAB_00112318:
      uVar15 = 0xffffffff;
      pQVar11 = &(local_1c8.d.d)->super_QArrayData;
    }
    else {
      pvVar12 = memchr(local_188.d.ptr,0x3a,local_188.d.size);
      if (pvVar12 == (void *)0x0) goto LAB_00112318;
      iVar2 = (int)pcVar13;
      uVar15 = (int)pvVar12 - iVar2;
      pQVar11 = &(local_1c8.d.d)->super_QArrayData;
      if (0 < (int)uVar15) {
        if ((uVar15 & 0x7fffffff) < uVar14) {
          QByteArray::QByteArray((QByteArray *)&local_b8,pcVar13,(ulong)(uVar15 & 0x7fffffff));
        }
        else {
          local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(local_188.d.d,0);
          local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_188.d.d >> 0x20);
          local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar13 >> 0x20);
          local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)uVar14;
          local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)(uVar14 >> 0x20);
          local_b8.a.a.a.a.a.a.d.ptr._0_4_ = iVar2;
          if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
            ;
            UNLOCK();
          }
        }
        pDVar10 = local_1c8.d.d;
        pQVar11 = (QArrayData *)
                  CONCAT44(local_b8.a.a.a.a.a.a.d.d._4_4_,local_b8.a.a.a.a.a.a.d.d._0_4_);
        pcVar3 = (char *)CONCAT44(local_b8.a.a.a.a.a.a.d.ptr._4_4_,(int)local_b8.a.a.a.a.a.a.d.ptr);
        local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(local_1c8.d.d,0);
        local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_1c8.d.d >> 0x20);
        psVar4 = (storage_type *)
                 CONCAT44(local_b8.a.a.a.a.a.a.d.size._4_4_,(undefined4)local_b8.a.a.a.a.a.a.d.size)
        ;
        local_b8.a.a.a.a.a.a.d.ptr._0_4_ = (int)local_1c8.d.ptr;
        local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)local_1c8.d.ptr >> 0x20);
        local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)local_1c8.d.size;
        local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)local_1c8.d.size >> 0x20);
        uVar14 = local_188.d.size;
        pcVar13 = local_188.d.ptr;
        local_1c8.d.ptr = pcVar3;
        local_1c8.d.size = (qsizetype)psVar4;
        if (&(local_1c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            local_1c8.d.d = (Data *)pQVar11;
            QArrayData::deallocate(&pDVar10->super_QArrayData,1,0x10);
            uVar14 = local_188.d.size;
            pcVar13 = local_188.d.ptr;
            pQVar11 = &(local_1c8.d.d)->super_QArrayData;
          }
        }
      }
    }
    local_1c8.d.d = (Data *)pQVar11;
    local_b8.a.a.a.a.a.a.d.d._0_4_ = (undefined4)uVar14;
    local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)(uVar14 >> 0x20);
    local_b8.a.a.a.a.a.a.d.ptr._0_4_ = (int)pcVar13;
    local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar13 >> 0x20);
    QByteArrayView::indexOf((QByteArrayView *)&local_b8,'.',(long)(int)(uVar15 + 1));
    QByteArray::mid((longlong)&local_b8,(longlong)&local_188);
    pDVar10 = local_1a8.d.d;
    pQVar11 = (QArrayData *)CONCAT44(local_b8.a.a.a.a.a.a.d.d._4_4_,local_b8.a.a.a.a.a.a.d.d._0_4_);
    pcVar13 = (char *)CONCAT44(local_b8.a.a.a.a.a.a.d.ptr._4_4_,(int)local_b8.a.a.a.a.a.a.d.ptr);
    local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(local_1a8.d.d,0);
    local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_1a8.d.d >> 0x20);
    psVar4 = (storage_type *)
             CONCAT44(local_b8.a.a.a.a.a.a.d.size._4_4_,(undefined4)local_b8.a.a.a.a.a.a.d.size);
    local_b8.a.a.a.a.a.a.d.ptr._0_4_ = (int)local_1a8.d.ptr;
    local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)local_1a8.d.ptr >> 0x20);
    local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)local_1a8.d.size;
    local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)local_1a8.d.size >> 0x20);
    local_1a8.d.ptr = pcVar13;
    local_1a8.d.size = (qsizetype)psVar4;
    if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        local_1a8.d.d = (Data *)pQVar11;
        QArrayData::deallocate(&pDVar10->super_QArrayData,1,0x10);
        pQVar11 = &(local_1a8.d.d)->super_QArrayData;
      }
    }
  }
  else {
    QByteArray::operator=(&local_1a8,&local_188);
    pQVar11 = &(local_1a8.d.d)->super_QArrayData;
  }
  local_1a8.d.d = (Data *)pQVar11;
  lcQpaInputMethods();
  if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
  {
    local_b8.a.a.a.a.a.a.d.d._0_4_ = 2;
    local_b8.a.a.a.a.a.a.d.d._4_4_ = 0;
    local_b8.a.a.a.a.a.a.d.ptr._0_4_ = 0;
    local_b8.a.a.a.a.a.a.d.ptr._4_4_ = 0;
    local_b8.a.a.a.a.a.a.d.size._0_4_ = 0;
    local_b8.a.a.a.a.a.a.d.size._4_4_ = 0;
    local_b8.a.a.a.a.a.b.m_size = (qsizetype)lcQpaInputMethods::category.name;
    QMessageLogger::debug();
    pDVar1 = local_170.a.a.a.a.d.d;
    QVar16.m_data = (storage_type *)0x5;
    QVar16.m_size = (qsizetype)&local_118;
    QString::fromUtf8(QVar16);
    QTextStream::operator<<((QTextStream *)pDVar1,(QString *)&local_118);
    if (&(local_118.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_118.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_118.a.a.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_170.a.a.a.a.d.d + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_170.a.a.a.a.d.d,' ');
    }
    pcVar13 = local_1c8.d.ptr;
    if (local_1c8.d.ptr == (char *)0x0) {
      pcVar13 = (char *)&QByteArray::_empty;
    }
    QDebug::putByteArray((char *)&local_170,(ulong)pcVar13,(Latin1Content)local_1c8.d.size);
    if (*(QTextStream *)((long)local_170.a.a.a.a.d.d + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_170.a.a.a.a.d.d,' ');
    }
    pDVar1 = local_170.a.a.a.a.d.d;
    QVar17.m_data = (storage_type *)0xd;
    QVar17.m_size = (qsizetype)&local_118;
    QString::fromUtf8(QVar17);
    QTextStream::operator<<((QTextStream *)pDVar1,(QString *)&local_118);
    if (&(local_118.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_118.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_118.a.a.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_170.a.a.a.a.d.d + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_170.a.a.a.a.d.d,' ');
    }
    pcVar13 = local_1a8.d.ptr;
    if (local_1a8.d.ptr == (char *)0x0) {
      pcVar13 = (char *)&QByteArray::_empty;
    }
    QDebug::putByteArray((char *)&local_170,(ulong)pcVar13,(Latin1Content)local_1a8.d.size);
    if (*(QTextStream *)((long)local_170.a.a.a.a.d.d + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_170.a.a.a.a.d.d,' ');
    }
    QDebug::~QDebug((QDebug *)&local_170);
  }
  QStandardPaths::writableLocation((StandardLocation)&local_1e8);
  uVar9 = local_1d8;
  uVar8 = uStack_1e0;
  pQVar7 = local_1e8;
  local_1d8 = 0;
  local_1e8 = (QArrayData *)0x0;
  uStack_1e0 = 0;
  QDBusConnection::localMachineId();
  QVar18.m_data = (storage_type *)local_1c8.d.size;
  QVar18.m_size = (qsizetype)&local_218;
  QString::fromLocal8Bit(QVar18);
  qVar6 = local_208;
  pcVar5 = pcStack_210;
  pQVar11 = local_218;
  local_170.a.a.a.b.m_size = 10;
  local_170.a.a.a.b.m_data = "/ibus/bus/";
  local_170.a.a.b.m_size = local_1f0;
  local_170.a.a.b.m_data = local_1f8;
  local_170.a.b = L'-';
  local_208 = 0;
  local_170.a.a.a.a.d.d = (Data *)0x0;
  local_170.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_170.a.a.a.a.d.size = 0;
  local_118.a.a.a.b.m_size = 10;
  local_118.a.a.a.b.m_data = "/ibus/bus/";
  local_118.a.a.b.m_size = local_1f0;
  local_118.a.a.b.m_data = local_1f8;
  local_118.a.b = L'-';
  local_170.b.d.d = (Data *)0x0;
  local_170.b.d.ptr = (char16_t *)0x0;
  local_170.b.d.size = 0;
  local_c0 = 0x2d;
  local_218 = (QArrayData *)0x0;
  pcStack_210 = (char16_t *)0x0;
  QVar19.m_data = (storage_type *)local_1a8.d.size;
  QVar19.m_size = (qsizetype)&local_238;
  QString::fromLocal8Bit(QVar19);
  local_b8.b.d.size = local_228;
  local_b8.b.d.ptr = pcStack_230;
  local_b8.b.d.d = (Data *)local_238;
  local_118.a.a.a.a.d.d = (Data *)0x0;
  local_118.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(pQVar7,0);
  local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar7 >> 0x20);
  local_b8.a.a.a.a.a.a.d.ptr._0_4_ = (int)uVar8;
  local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
  local_118.a.a.a.a.d.size = 0;
  local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)uVar9;
  local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
  local_b8.a.a.a.a.a.b.m_size = local_118.a.a.a.b.m_size;
  local_b8.a.a.a.a.a.b.m_data = local_118.a.a.a.b.m_data;
  local_b8.a.a.a.a.b.m_size = local_118.a.a.b.m_size;
  local_b8.a.a.a.a.b.m_data = local_118.a.a.b.m_data;
  local_b8.a.a.a.b = L'-';
  local_118.b.d.d = (Data *)0x0;
  local_118.b.d.ptr = (char16_t *)0x0;
  local_b8.a.a.b.d.d = (Data *)pQVar11;
  local_b8.a.a.b.d.ptr = pcVar5;
  local_118.b.d.size = 0;
  local_b8.a.a.b.d.size = qVar6;
  local_b8.a.b = L'-';
  local_238 = (QArrayData *)0x0;
  pcStack_230 = (char16_t *)0x0;
  local_228 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
  ::convertTo<QString>(in_RDI,&local_b8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
  ::~QStringBuilder(&local_b8);
  if (local_238 != (QArrayData *)0x0) {
    LOCK();
    (local_238->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_238->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_238->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_238,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
  ::~QStringBuilder(&local_118);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
  ::~QStringBuilder(&local_170);
  if (local_218 != (QArrayData *)0x0) {
    LOCK();
    (local_218->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_218->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_218->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_218,2,0x10);
    }
  }
  if (local_200 != (QArrayData *)0x0) {
    LOCK();
    (local_200->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_200->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_200->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_200,1,0x10);
    }
  }
  if (local_1e8 != (QArrayData *)0x0) {
    LOCK();
    (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1e8,2,0x10);
    }
  }
  if (&(local_1c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1c8.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_00111c77:
  if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QIBusPlatformInputContextPrivate::getSocketPath()
{
    QByteArray display;
    QByteArray displayNumber = "0";
    bool isWayland = false;

    if (QString path = qEnvironmentVariable("IBUS_ADDRESS_FILE"); !path.isNull()) {
        return path;
    } else if (display = qgetenv("WAYLAND_DISPLAY"); !display.isEmpty()) {
        isWayland = true;
    } else {
        display = qgetenv("DISPLAY");
    }
    QByteArray host = "unix";

    if (isWayland) {
        displayNumber = display;
    } else {
        int pos = display.indexOf(':');
        if (pos > 0)
            host = display.left(pos);
        ++pos;
        int pos2 = display.indexOf('.', pos);
        if (pos2 > 0)
            displayNumber = display.mid(pos, pos2 - pos);
         else
            displayNumber = display.mid(pos);
    }

    qCDebug(lcQpaInputMethods) << "host=" << host << "displayNumber" << displayNumber;

    return QStandardPaths::writableLocation(QStandardPaths::ConfigLocation) +
               "/ibus/bus/"_L1 +
               QLatin1StringView(QDBusConnection::localMachineId()) +
               u'-' + QString::fromLocal8Bit(host) + u'-' + QString::fromLocal8Bit(displayNumber);
}